

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void setalias(char *name,tagval *v)

{
  char cVar1;
  uint *puVar2;
  ident *id;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *local_78;
  ident local_70;
  ident *local_30;
  
  local_78 = name;
  id = hashset<ident>::access<char_const*>(&idents,&local_78);
  pcVar6 = local_78;
  if (id != (ident *)0x0) {
    if (id->type == 4) {
      if (id->index < 0x19) {
        setarg(id,v);
        return;
      }
      if (((id->field_2).minval == 3) && ((id->field_4).args != (char *)0x0)) {
        operator_delete__((id->field_4).args);
      }
      id->field_2 = (anon_union_4_3_c060dbb1_for_ident_2)v->type;
      (id->field_4).val.field_0 = (v->super_identval).field_0;
      puVar2 = (id->field_3).code;
      if (puVar2 != (uint *)0x0) {
        *puVar2 = *puVar2 - 0x100;
        if ((int)*(id->field_3).code < 0x100) {
          operator_delete__((id->field_3).code);
        }
        (id->field_3).code = (uint *)0x0;
      }
      id->flags = identflags;
      return;
    }
    pcVar5 = "cannot redefine builtin %s with an alias";
    pcVar6 = id->name;
    goto LAB_00126f97;
  }
  cVar1 = *local_78;
  if (9 < (int)cVar1 - 0x30U) {
    if (cVar1 == '+') {
LAB_00126fea:
      if ((int)local_78[1] - 0x30U < 10) goto LAB_00126f80;
      lVar3 = 2;
      if (local_78[1] != '.') goto LAB_00127073;
    }
    else {
      if (cVar1 != '.') {
        if (cVar1 != '-') goto LAB_00127073;
        goto LAB_00126fea;
      }
      lVar3 = 1;
    }
    if (9 < (int)local_78[lVar3] - 0x30U) {
LAB_00127073:
      sVar4 = strlen(local_78);
      pcVar5 = (char *)operator_new__(sVar4 + 1);
      strncpy(pcVar5,pcVar6,sVar4 + 1);
      pcVar5[sVar4] = '\0';
      local_70.type = 4;
      local_70.field_2 = (anon_union_4_3_c060dbb1_for_ident_2)v->type;
      local_70.field_3.code = (uint *)0x0;
      local_70.field_5.stack = (identstack *)0x0;
      local_70.flags = identflags;
      local_70.field_4.val.field_0 = *(identval *)&(v->super_identval).field_0;
      local_70.name = pcVar5;
      if (initedidents != '\0') {
        local_30 = hashset<ident>::access<char_const*,ident>(&idents,&local_70.name,&local_70);
        local_30->index = identmap.ulen;
        vector<ident_*>::add(&identmap,&local_30);
        return;
      }
      if (identinits == (vector<ident> *)0x0) {
        identinits = (vector<ident> *)operator_new(0x10);
        identinits->buf = (ident *)0x0;
        identinits->alen = 0;
        identinits->ulen = 0;
      }
      vector<ident>::add(identinits,&local_70);
      return;
    }
  }
LAB_00126f80:
  pcVar5 = "cannot alias number %s";
LAB_00126f97:
  debugcode(pcVar5,pcVar6);
  pcVar6 = (v->super_identval).field_0.s;
  if (v->type == 5) {
    if (*(int *)(pcVar6 + -4) != 0) {
      return;
    }
    pcVar6 = pcVar6 + -4;
  }
  else {
    if (v->type != 3) {
      return;
    }
    if (pcVar6 == (char *)0x0) {
      return;
    }
  }
  operator_delete__(pcVar6);
  return;
}

Assistant:

static void setalias(const char *name, tagval &v)
{
    ident *id = idents.access(name);
    if(id)
    {
        if(id->type == ID_ALIAS)
        {
            if(id->index < MAXARGS) setarg(*id, v); else setalias(*id, v);
        }
        else
        {
            debugcode("cannot redefine builtin %s with an alias", id->name);
            freearg(v);
        }
    }
    else if(checknumber(name))
    {
        debugcode("cannot alias number %s", name);
        freearg(v);
    }
    else
    {
        addident(ident(ID_ALIAS, newstring(name), v, identflags));
    }
}